

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O3

void * __thiscall
icu_63::SpoofData::reserveSpace(SpoofData *this,int32_t numBytes,UErrorCode *status)

{
  uint uVar1;
  SpoofDataHeader *pSVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  
  if (U_ZERO_ERROR < *status) {
    return (void *)0x0;
  }
  if (this->fDataOwned == '\0') {
    *status = U_INTERNAL_PROGRAM_ERROR;
    puVar3 = (uint8_t *)0x0;
  }
  else {
    uVar5 = numBytes + 0xfU & 0xfffffff0;
    uVar1 = this->fMemLimit;
    uVar4 = uVar1 + uVar5;
    this->fMemLimit = uVar4;
    pSVar2 = (SpoofDataHeader *)uprv_realloc_63(this->fRawData,(ulong)uVar4);
    this->fRawData = pSVar2;
    pSVar2->fLength = this->fMemLimit;
    memset(pSVar2->fFormatVersion + ((ulong)uVar1 - 4),0,(long)(int)uVar5);
    this->fCFUKeys = (int32_t *)0x0;
    this->fCFUValues = (uint16_t *)0x0;
    this->fCFUStrings = (UChar *)0x0;
    pSVar2 = this->fRawData;
    if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
      if ((long)pSVar2->fCFUKeys != 0) {
        this->fCFUKeys = (int32_t *)(pSVar2->fFormatVersion + (long)pSVar2->fCFUKeys + -4);
      }
      if ((long)pSVar2->fCFUStringIndex != 0) {
        this->fCFUValues = (uint16_t *)(pSVar2->fFormatVersion + (long)pSVar2->fCFUStringIndex + -4)
        ;
      }
      if ((long)pSVar2->fCFUStringTable != 0) {
        this->fCFUStrings = (UChar *)(pSVar2->fFormatVersion + (long)pSVar2->fCFUStringTable + -4);
      }
    }
    puVar3 = pSVar2->fFormatVersion + ((ulong)uVar1 - 4);
  }
  return puVar3;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }